

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O2

shared_ptr<_IO_FILE> __thiscall
phosg::fopen_shared(phosg *this,string *filename,string *mode,FILE *dash_file)

{
  bool bVar1;
  undefined8 *puVar2;
  FILE *__p;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  shared_ptr<_IO_FILE> sVar4;
  __allocator_type __a2;
  __allocated_ptr<std::allocator<std::_Sp_counted_deleter<_IO_FILE_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_fuzziqersoftware[P]phosg_src_Filesystem_cc:593:40),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_30;
  
  if (dash_file != (FILE *)0x0) {
    bVar1 = ::std::operator==(filename,"-");
    if (bVar1) {
      *(FILE **)this = dash_file;
      *(undefined8 *)(this + 8) = 0;
      puVar2 = (undefined8 *)operator_new(0x18);
      local_30._M_alloc = &__a2;
      puVar2[1] = 0x100000001;
      *puVar2 = &PTR___Sp_counted_base_00128ac0;
      puVar2[2] = dash_file;
      *(undefined8 **)(this + 8) = puVar2;
      local_30._M_ptr = (pointer)0x0;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_deleter<_IO_FILE_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/Filesystem.cc:593:40),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr(&local_30);
      _Var3._M_pi = extraout_RDX;
      goto LAB_001098c2;
    }
  }
  __p = fopen_binary_raw(filename,mode);
  ::std::__shared_ptr<_IO_FILE,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<_IO_FILE,void(*)(_IO_FILE*),void>
            ((__shared_ptr<_IO_FILE,(__gnu_cxx::_Lock_policy)2> *)this,__p,fclose_raw);
  _Var3._M_pi = extraout_RDX_00;
LAB_001098c2:
  sVar4.super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar4.super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<_IO_FILE>)sVar4.super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<FILE> fopen_shared(const string& filename, const string& mode, FILE* dash_file) {
  if (dash_file && (filename == "-")) {
    return shared_ptr<FILE>(dash_file, [](FILE*) {});
  }
  return shared_ptr<FILE>(fopen_binary_raw(filename, mode), fclose_raw);
}